

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O3

void __thiscall RVO::RVOSimulator::removeObstacle(RVOSimulator *this,size_t obstacleNo)

{
  pointer *pppOVar1;
  
  operator_delete((this->obstacles_).
                  super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
                  super__Vector_impl_data._M_start[obstacleNo],0x10);
  (this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
  super__Vector_impl_data._M_start[obstacleNo] =
       (this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>.
       _M_impl.super__Vector_impl_data._M_finish[-1];
  pppOVar1 = &(this->obstacles_).
              super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppOVar1 = *pppOVar1 + -1;
  return;
}

Assistant:

void RVOSimulator::removeObstacle(size_t obstacleNo)
	{
		delete obstacles_[obstacleNo];
		obstacles_[obstacleNo] = obstacles_.back();
		obstacles_.pop_back();
	}